

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STTx.cpp
# Opt level: O0

Value __thiscall jbcoin::STTx::getJson(STTx *this,int options,bool binary)

{
  jbcoin *this_00;
  Value *pVVar1;
  byte in_CL;
  undefined7 in_register_00000011;
  Blob *vucData;
  base_uint<256UL,_void> *a;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined4 in_register_00000034;
  Value VVar3;
  uint256 local_c8;
  string local_a8;
  Value local_88;
  string local_78;
  Value local_58 [2];
  undefined1 local_38 [8];
  Serializer s;
  bool binary_local;
  int options_local;
  STTx *this_local;
  Value *ret;
  undefined8 uVar2;
  
  s.mData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ =
       (undefined4)CONCAT71(in_register_00000011,binary);
  s.mData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._3_1_ = in_CL & 1;
  if (s.mData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._3_1_ == 0) {
    VVar3 = getJson(this,options);
    uVar2 = VVar3._8_8_;
  }
  else {
    s.mData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._2_1_ = 0;
    Json::Value::Value((Value *)this,nullValue);
    STObject::getSerializer
              ((Serializer *)local_38,(STObject *)CONCAT44(in_register_00000034,options));
    this_00 = (jbcoin *)Serializer::peekData((Serializer *)local_38);
    strHex_abi_cxx11_(&local_78,this_00,vucData);
    Json::Value::Value(local_58,&local_78);
    pVVar1 = Json::Value::operator[]((Value *)this,(StaticString *)&jss::tx);
    Json::Value::operator=(pVVar1,local_58);
    Json::Value::~Value(local_58);
    std::__cxx11::string::~string((string *)&local_78);
    getTransactionID(&local_c8,(STTx *)CONCAT44(in_register_00000034,options));
    to_string<256ul,void>(&local_a8,(jbcoin *)&local_c8,a);
    Json::Value::Value(&local_88,&local_a8);
    pVVar1 = Json::Value::operator[]((Value *)this,(StaticString *)&jss::hash);
    Json::Value::operator=(pVVar1,&local_88);
    Json::Value::~Value(&local_88);
    std::__cxx11::string::~string((string *)&local_a8);
    s.mData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._2_1_ = 1;
    Serializer::~Serializer((Serializer *)local_38);
    uVar2 = extraout_RDX;
    if ((s.mData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._2_1_ & 1) == 0) {
      Json::Value::~Value((Value *)this);
      uVar2 = extraout_RDX_00;
    }
  }
  VVar3._8_8_ = uVar2;
  VVar3.value_.map_ = (ObjectValues *)this;
  return VVar3;
}

Assistant:

Json::Value STTx::getJson (int options, bool binary) const
{
    if (binary)
    {
        Json::Value ret;
        Serializer s = STObject::getSerializer ();
        ret[jss::tx] = strHex (s.peekData ());
        ret[jss::hash] = to_string (getTransactionID ());
        return ret;
    }
    return getJson(options);
}